

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::CleanUpForInCache(FunctionBody *this,bool isShutdown)

{
  uint32 uVar1;
  EnumeratorCache *obj;
  
  uVar1 = GetCountField(this,ProfiledForInLoopCount);
  if ((short)uVar1 != 0) {
    obj = (EnumeratorCache *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,ForInCacheArray);
    if (obj != (EnumeratorCache *)0x0) {
      if (isShutdown) {
        memset(obj,0,(ulong)((uVar1 & 0xffff) << 4));
        return;
      }
      Memory::DeleteArray<Memory::CacheAllocator,Js::EnumeratorCache>
                (&((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                  enumeratorCacheAllocator,(ulong)(uVar1 & 0xffff),obj);
      FunctionProxy::SetAuxPtr((FunctionProxy *)this,ForInCacheArray,(void *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void FunctionBody::CleanUpForInCache(bool isShutdown)
    {
        uint profiledForInLoopCount = this->GetProfiledForInLoopCount();
        if (profiledForInLoopCount == 0)
        {
            return;
        }
        EnumeratorCache * forInCacheArray = this->GetAuxPtr<AuxPointerType::ForInCacheArray>();
        if (forInCacheArray)
        {
            if (isShutdown)
            {
                memset(forInCacheArray, 0, sizeof(EnumeratorCache) * profiledForInLoopCount);
            }
            else
            {
                AllocatorDeleteArray(CacheAllocator, this->GetScriptContext()->GetEnumeratorAllocator(), profiledForInLoopCount, forInCacheArray);
                this->SetAuxPtr<AuxPointerType::ForInCacheArray>(nullptr);
            }
        }
    }